

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O2

ImageVolume * __thiscall
CppCNN::normalize_examples(ImageVolume *__return_storage_ptr__,CppCNN *this,ImageVolume *examples)

{
  pointer pvVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar2;
  ostream *poVar3;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *input;
  pointer pvVar4;
  Matrix<double,__1,__1,_0,__1,__1> *channel;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Scalar local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"normalize_examples");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::vector(__return_storage_ptr__,examples);
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (__return_storage_ptr__->
                super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar1; pvVar4 = pvVar4 + 1) {
    pDVar2 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             (pvVar4->
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   (pvVar4->
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; this_00 != pDVar2;
        this_00 = this_00 + 0x18) {
      local_38 = 255.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator/=(this_00,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ImageVolume CppCNN::normalize_examples(const ImageVolume& examples) {
	cout << __FUNCTION__ << endl;

	ImageVolume examples_norm = examples;
	for (auto& input : examples_norm)
		for (auto& channel : input)
			channel /= 255.0;

	return examples_norm;
}